

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int lnsrch(custom_function *funcpt,double *xi,double *jac,double *p,int N,double *dx,double maxstep,
          double stol,double *x)

{
  uint uVar1;
  double *C;
  double *A;
  double *B;
  double *C_00;
  double *array;
  double *B_00;
  ulong uVar2;
  double *pdVar3;
  char *__format;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  C = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_00 = (double *)malloc(0x10);
  array = (double *)malloc((long)N * 8);
  B_00 = (double *)malloc((long)N * 8);
  uVar4 = (ulong)(uint)N;
  dVar7 = 0.0;
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar7 = dVar7 + dx[uVar2] * p[uVar2] * dx[uVar2] * p[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  if (maxstep < dVar7) {
    scale(p,1,N,maxstep / dVar7);
  }
  mmult(jac,p,C,1,N,1);
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar7 = ABS(xi[uVar2]);
      if (ABS(xi[uVar2]) <= 1.0 / ABS(dx[uVar2])) {
        dVar7 = 1.0 / ABS(dx[uVar2]);
      }
      array[uVar2] = p[uVar2] / dVar7;
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  dVar7 = array_max_abs(array,N);
  dVar8 = (*funcpt->funcpt)(xi,N,funcpt->params);
  __format = "Program Exiting as the function value exceeds the maximum double value";
  if (ABS(dVar8) < 1.79769313486232e+308) {
    if (!NAN(dVar8)) {
      dVar12 = 1.0;
      dVar13 = 1.0;
      dVar11 = 1.0;
      uVar1 = 0;
      do {
        if (0 < N) {
          uVar2 = 0;
          do {
            B_00[uVar2] = p[uVar2] * dVar11;
            uVar2 = uVar2 + 1;
          } while (uVar4 != uVar2);
        }
        madd(xi,B_00,x,1,N);
        dVar9 = (*funcpt->funcpt)(x,N,funcpt->params);
        if (1.79769313486232e+308 <= ABS(dVar9)) {
          __format = "Program Exiting as the function value exceeds the maximum double value";
          goto LAB_00124644;
        }
        if (NAN(dVar9)) {
          __format = "Program Exiting as the function returns NaN";
          goto LAB_00124644;
        }
        dVar10 = *C;
        if (dVar9 <= dVar11 * 0.0001 * dVar10 + dVar8) {
          iVar5 = 0;
          goto LAB_00124651;
        }
        if (dVar11 < stol / dVar7) {
          iVar5 = 1;
          if (0 < N) {
            uVar2 = 0;
            do {
              x[uVar2] = xi[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar4 != uVar2);
          }
          goto LAB_00124651;
        }
        if ((dVar11 != 1.0) || (NAN(dVar11))) {
          *A = 1.0 / (dVar11 * dVar11);
          A[1] = -1.0 / (dVar12 * dVar12);
          A[2] = -dVar12 / (dVar11 * dVar11);
          A[3] = dVar11 / (dVar12 * dVar12);
          *B = (dVar9 - dVar8) - dVar11 * dVar10;
          B[1] = (dVar13 - dVar8) - dVar12 * dVar10;
          mmult(A,B,C_00,2,2,1);
          scale(C_00,1,2,1.0 / (dVar11 - dVar12));
          dVar12 = *C_00;
          if ((dVar12 != 0.0) || (NAN(dVar12))) {
            dVar13 = C_00[1];
            dVar10 = dVar13 * dVar13 + dVar12 * -3.0 * *C;
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            dVar10 = dVar10 - dVar13;
            dVar12 = 3.0;
            pdVar3 = C_00;
          }
          else {
            dVar10 = -*C;
            dVar12 = 2.0;
            pdVar3 = C_00 + 1;
          }
          dVar10 = dVar10 / (dVar12 * *pdVar3);
          if (dVar11 * 0.5 < dVar10) {
            dVar10 = dVar11 * 0.5;
          }
        }
        else {
          dVar12 = (dVar9 - dVar8) - dVar10;
          dVar10 = -dVar10 / (dVar12 + dVar12);
        }
        uVar2 = -(ulong)(dVar10 <= dVar11 * 0.1);
        bVar6 = uVar1 < 999;
        dVar12 = dVar11;
        dVar13 = dVar9;
        dVar11 = (double)(~uVar2 & (ulong)dVar10 | (ulong)(dVar11 * 0.1) & uVar2);
        uVar1 = uVar1 + 1;
      } while (bVar6);
      iVar5 = 100;
      goto LAB_00124651;
    }
    __format = "Program Exiting as the function returns NaN";
  }
LAB_00124644:
  printf(__format);
  iVar5 = 0xf;
LAB_00124651:
  free(C);
  free(A);
  free(B);
  free(C_00);
  free(array);
  free(B_00);
  return iVar5;
}

Assistant:

int lnsrch(custom_function *funcpt,double *xi,double *jac,double *p,int N,double * dx,double maxstep,double stol,double *x) {
	int retval,i,iter,MAXITER;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	
	slopei = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	MAXITER = 1000;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	iter = 0;
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	//mdisplay(p,1,N);
	funci = FUNCPT_EVAL(funcpt, xi, N);
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		return 15;
	}
	while (retval > 1 && iter < MAXITER) {
		iter++;
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			return 15;
		}

		//printf("lambda %g %g %g \n",funcf,funci,lambda);
		
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			retval = 0;
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	return retval;
}